

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

TPZSkylMatrix<float> * __thiscall
TPZSkylMatrix<float>::operator*=(TPZSkylMatrix<float> *this,float value)

{
  _func_int **pp_Var1;
  float **ppfVar2;
  float *pfVar3;
  int iVar4;
  int extraout_var;
  float *pfVar5;
  long lVar6;
  
  pp_Var1 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
  if (1e-06 <= ABS(value)) {
    iVar4 = (*pp_Var1[0xc])();
    if (CONCAT44(extraout_var,iVar4) != 0 && -1 < extraout_var) {
      ppfVar2 = (this->fElem).fStore;
      lVar6 = 0;
      pfVar5 = *ppfVar2;
      do {
        pfVar3 = ppfVar2[lVar6 + 1];
        for (; pfVar5 < pfVar3; pfVar5 = pfVar5 + 1) {
          *pfVar5 = *pfVar5 * value;
        }
        lVar6 = lVar6 + 1;
        pfVar5 = pfVar3;
      } while (lVar6 != CONCAT44(extraout_var,iVar4));
    }
    (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
  }
  else {
    (*pp_Var1[0xf])();
  }
  return this;
}

Assistant:

TPZSkylMatrix<TVar> &
TPZSkylMatrix<TVar>::operator*=(const TVar value )
{
	if ( IsZero( value ) )
    {
		Zero();
		return( *this );
    }
	
	int64_t col, colmax = this->Dim();
	for (col=0; col<colmax; col++ )
    {
		// Efetua a MULTIPLICACAO.
		TVar *elem = fElem[col];
		TVar *end  = fElem[col+1];
		while ( elem < end ) *elem++ *= value;
    }
	
	this->fDecomposed = 0;
	return( *this );
}